

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterintra_sse4.c
# Opt level: O2

void filter_4x2_sse4_1(uint8_t *dst,ptrdiff_t stride,__m128i *pixels,__m128i *taps_0_1,
                      __m128i *taps_2_3,__m128i *taps_4_5,__m128i *taps_6_7)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar6 = pmaddubsw((undefined1  [16])*pixels,(undefined1  [16])*taps_0_1);
  auVar5 = pmaddubsw((undefined1  [16])*pixels,(undefined1  [16])*taps_2_3);
  auVar6 = phaddw(auVar6,auVar5);
  auVar6 = phaddw(auVar6,auVar6);
  auVar5 = pmovsxbw(auVar5,0x808080808080808);
  auVar7._0_2_ = auVar6._0_2_ + auVar5._0_2_;
  auVar7._2_2_ = auVar6._2_2_ + auVar5._2_2_;
  auVar7._4_2_ = auVar6._4_2_ + auVar5._4_2_;
  auVar7._6_2_ = auVar6._6_2_ + auVar5._6_2_;
  auVar7._8_2_ = auVar6._8_2_ + auVar5._8_2_;
  auVar7._10_2_ = auVar6._10_2_ + auVar5._10_2_;
  auVar7._12_2_ = auVar6._12_2_ + auVar5._12_2_;
  auVar7._14_2_ = auVar6._14_2_ + auVar5._14_2_;
  auVar6 = psraw(auVar7,4);
  sVar1 = auVar6._0_2_;
  sVar2 = auVar6._2_2_;
  sVar3 = auVar6._4_2_;
  sVar4 = auVar6._6_2_;
  *(uint *)dst = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar6[6] - (0xff < sVar4),
                          CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar6[4] - (0xff < sVar3),
                                   CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar6[2] -
                                            (0xff < sVar2),
                                            (0 < sVar1) * (sVar1 < 0x100) * auVar6[0] -
                                            (0xff < sVar1))));
  auVar7 = pmaddubsw((undefined1  [16])*pixels,(undefined1  [16])*taps_4_5);
  auVar6 = pmaddubsw((undefined1  [16])*pixels,(undefined1  [16])*taps_6_7);
  auVar6 = phaddw(auVar7,auVar6);
  auVar6 = phaddw(auVar6,auVar6);
  auVar8._0_2_ = auVar6._0_2_ + auVar5._0_2_;
  auVar8._2_2_ = auVar6._2_2_ + auVar5._2_2_;
  auVar8._4_2_ = auVar6._4_2_ + auVar5._4_2_;
  auVar8._6_2_ = auVar6._6_2_ + auVar5._6_2_;
  auVar8._8_2_ = auVar6._8_2_ + auVar5._8_2_;
  auVar8._10_2_ = auVar6._10_2_ + auVar5._10_2_;
  auVar8._12_2_ = auVar6._12_2_ + auVar5._12_2_;
  auVar8._14_2_ = auVar6._14_2_ + auVar5._14_2_;
  auVar5 = psraw(auVar8,4);
  sVar1 = auVar5._0_2_;
  sVar2 = auVar5._2_2_;
  sVar3 = auVar5._4_2_;
  sVar4 = auVar5._6_2_;
  *(uint *)(dst + stride) =
       CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar5[6] - (0xff < sVar4),
                CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar5[4] - (0xff < sVar3),
                         CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar5[2] - (0xff < sVar2),
                                  (0 < sVar1) * (sVar1 < 0x100) * auVar5[0] - (0xff < sVar1))));
  return;
}

Assistant:

static inline void filter_4x2_sse4_1(uint8_t *dst, const ptrdiff_t stride,
                                     const __m128i *pixels,
                                     const __m128i *taps_0_1,
                                     const __m128i *taps_2_3,
                                     const __m128i *taps_4_5,
                                     const __m128i *taps_6_7) {
  const __m128i mul_0_01 = _mm_maddubs_epi16(*pixels, *taps_0_1);
  const __m128i mul_0_23 = _mm_maddubs_epi16(*pixels, *taps_2_3);
  // |output_half| contains 8 partial sums.
  __m128i output_half = _mm_hadd_epi16(mul_0_01, mul_0_23);
  __m128i output = _mm_hadd_epi16(output_half, output_half);
  const __m128i output_row0 =
      _mm_packus_epi16(xx_roundn_epi16_unsigned(output, 4),
                       /* arbitrary pack arg */ output);
  xx_storel_32(dst, output_row0);
  const __m128i mul_1_01 = _mm_maddubs_epi16(*pixels, *taps_4_5);
  const __m128i mul_1_23 = _mm_maddubs_epi16(*pixels, *taps_6_7);
  output_half = _mm_hadd_epi16(mul_1_01, mul_1_23);
  output = _mm_hadd_epi16(output_half, output_half);
  const __m128i output_row1 =
      _mm_packus_epi16(xx_roundn_epi16_unsigned(output, 4),
                       /* arbitrary pack arg */ output);
  xx_storel_32(dst + stride, output_row1);
}